

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O1

void generate<trng::yarn4>(size_t samples,unsigned_long seed)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  parameter_type P;
  yarn4 r;
  char local_51;
  yarn4 local_50;
  
  P.a._8_8_ = DAT_00230218;
  P.a._0_8_ = trng::yarn4::LEcuyer1;
  trng::yarn4::yarn4(&local_50,P);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# generator ",0xc);
  __s = trng::yarn4::name();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3510d0);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  seed = ",9);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"type: d\n",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"count: ",7);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"numbit: ",8);
  iVar1 = trng::int_math::log2_ceil<int>(0x7ffffffe);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  local_51 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_51,1);
  if (samples != 0) {
    do {
      uVar6 = (long)local_50.S.r[3] * (long)local_50.P.a[3] +
              (long)local_50.P.a[2] * (long)local_50.S.r[2] +
              (long)local_50.P.a[1] * (long)local_50.S.r[1] +
              (long)local_50.P.a[0] * (long)local_50.S.r[0];
      local_50.S.r[3] = local_50.S.r[2];
      uVar7 = (uVar6 >> 0x1f) + (uVar6 & 0x7fffffff);
      uVar6 = uVar7 - 0x1fffffffc;
      if ((uint)(uVar7 >> 2) < 0x7fffffff) {
        uVar6 = uVar7;
      }
      uVar7 = uVar6 - 0xfffffffe;
      if (uVar6 < 0xfffffffe) {
        uVar7 = uVar6;
      }
      local_50.S.r[2] = local_50.S.r[1];
      local_50.S.r[1] = local_50.S.r[0];
      local_50.S.r[0] = (uint)uVar7 + 0x80000001;
      if (uVar7 < 0x7fffffff) {
        local_50.S.r[0] = (uint)uVar7;
      }
      if (local_50.S.r[0] == 0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (uint)((ulong)*(uint *)(trng::yarn4::g + (ulong)(local_50.S.r[0] & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn4::g +
                                      (long)(local_50.S.r[0] >> 0x10) * 4 + 0x40000)) & 0x7fffffff;
        iVar1 = (int)((ulong)*(uint *)(trng::yarn4::g + (ulong)(local_50.S.r[0] & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn4::g +
                                      (long)(local_50.S.r[0] >> 0x10) * 4 + 0x40000) >> 0x1f);
        uVar5 = uVar4 + iVar1;
        uVar4 = uVar4 + 0x80000001 + iVar1;
        if (uVar5 < 0x7fffffff) {
          uVar4 = uVar5;
        }
      }
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar4);
      local_51 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_51,1);
      samples = samples - 1;
    } while (samples != 0);
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}